

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateAnyMethodDefinition
          (MessageGenerator *this,Printer *p)

{
  bool bVar1;
  undefined8 extraout_RAX;
  anon_class_1_0_00000001 local_109;
  Descriptor *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  Printer *local_e8;
  undefined1 local_e0 [17];
  undefined7 uStack_cf;
  SplitMap *pSStack_c8;
  undefined1 local_c0 [24];
  code *local_a8;
  byte local_a0;
  FeatureSet *local_98;
  undefined1 local_90 [24];
  undefined1 local_78;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_70;
  
  local_e8 = p;
  bVar1 = IsAnyMessage(this->descriptor_);
  if (bVar1) {
    local_108 = (Descriptor *)local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"any_methods","");
    local_e0._0_8_ = local_e0 + 0x10;
    if (local_108 == (Descriptor *)local_f8) {
      pSStack_c8 = (SplitMap *)local_f8._8_8_;
    }
    else {
      local_e0._0_8_ = local_108;
    }
    stack0xffffffffffffff30 = (AccessInfoMap *)CONCAT71(local_f8._1_7_,local_f8[0]);
    local_e0._8_8_ = local_100;
    local_100 = 0;
    local_f8[0] = 0;
    local_108 = (Descriptor *)local_f8;
    local_c0._0_8_ = operator_new(0x18);
    *(MessageGenerator **)local_c0._0_8_ = this;
    *(Printer ***)(local_c0._0_8_ + 8) = &local_e8;
    *(undefined1 *)(local_c0._0_8_ + 0x10) = 0;
    local_a8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    local_c0._8_8_ = 0;
    local_c0._16_8_ =
         std::
         _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
         ::_M_manager;
    local_a0 = 1;
    local_90._0_8_ = 0;
    local_90[8] = '\0';
    local_78 = 0;
    local_98 = (FeatureSet *)(local_90 + 8);
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x522f0c);
    local_70._M_engaged = false;
    io::Printer::Emit(p,local_e0,1,0x187,
                      "\n        // implements Any\n        // -----------------------------------------------\n\n        $any_methods$;\n\n        template <typename T>\n        bool Is() const {\n          return $pbi$::InternalIs<T>(_internal_type_url());\n        }\n        static bool ParseAnyTypeUrl(\n            //~\n            ::absl::string_view type_url,\n            std::string* $nonnull$ full_type_name);\n      "
                     );
    if (local_70._M_engaged == true) {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                (&local_70);
    }
    if (local_98 != (FeatureSet *)(local_90 + 8)) {
      operator_delete(local_98,CONCAT71(local_90._9_7_,local_90[8]) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[local_a0]._M_data)
              (&local_109,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)local_c0);
    local_a0 = 0xff;
    if ((Descriptor *)local_e0._0_8_ != (Descriptor *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,(ulong)(stack0xffffffffffffff30 + 1));
    }
    if (local_108 != (Descriptor *)local_f8) {
      operator_delete(local_108,CONCAT71(local_f8._1_7_,local_f8[0]) + 1);
    }
    return;
  }
  GenerateAnyMethodDefinition((MessageGenerator *)local_e0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void MessageGenerator::GenerateAnyMethodDefinition(io::Printer* p) {
  ABSL_DCHECK(IsAnyMessage(descriptor_));

  p->Emit(
      {{"any_methods",
        [&] {
          if (HasDescriptorMethods(descriptor_->file(), options_)) {
            p->Emit(
                R"cc(
                  bool PackFrom(const $pb$::Message& message) {
                    $DCHK$_NE(&message, this);
                    return $pbi$::InternalPackFrom(message, mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  bool PackFrom(const $pb$::Message& message,
                                ::absl::string_view type_url_prefix) {
                    $DCHK$_NE(&message, this);
                    return $pbi$::InternalPackFrom(message, type_url_prefix,
                                                   mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  bool UnpackTo($pb$::Message* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo(_internal_type_url(),
                                                   _internal_value(), message);
                  }
                  static bool GetAnyFieldDescriptors(
                      const $pb$::Message& message,
                      const $pb$::FieldDescriptor* $nullable$* $nonnull$
                          type_url_field,
                      const $pb$::FieldDescriptor* $nullable$* $nonnull$
                          value_field);
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool PackFrom(const T& message) {
                    return $pbi$::InternalPackFrom<T>(
                        message, mutable_type_url(), _internal_mutable_value());
                  }
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool PackFrom(const T& message,
                                ::absl::string_view type_url_prefix) {
                    return $pbi$::InternalPackFrom<T>(
                        message, type_url_prefix, mutable_type_url(),
                        _internal_mutable_value());
                  }
                  template <
                      typename T,
                      class = typename std::enable_if<!std::is_convertible<
                          T, const $pb$::Message&>::value>::type>
                  bool UnpackTo(T* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo<T>(
                        _internal_type_url(), _internal_value(), message);
                  }
                )cc");
          } else {
            p->Emit(
                R"cc(
                  template <typename T>
                  bool PackFrom(const T& message) {
                    return $pbi$::InternalPackFrom(message, mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  template <typename T>
                  bool PackFrom(const T& message,
                                ::absl::string_view type_url_prefix) {
                    return $pbi$::InternalPackFrom(message, type_url_prefix,
                                                   mutable_type_url(),
                                                   _internal_mutable_value());
                  }
                  template <typename T>
                  bool UnpackTo(T* $nonnull$ message) const {
                    return $pbi$::InternalUnpackTo(_internal_type_url(),
                                                   _internal_value(), message);
                  }
                )cc");
          }
        }}},
      R"cc(
        // implements Any
        // -----------------------------------------------

        $any_methods$;

        template <typename T>
        bool Is() const {
          return $pbi$::InternalIs<T>(_internal_type_url());
        }
        static bool ParseAnyTypeUrl(
            //~
            ::absl::string_view type_url,
            std::string* $nonnull$ full_type_name);
      )cc");
}